

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

bool __thiscall google::protobuf::TextFormat::Parser::ParserImpl::SkipFieldMessage(ParserImpl *this)

{
  size_t sVar1;
  bool bVar2;
  int iVar3;
  char *__end;
  bool bVar4;
  string delimiter;
  long *local_90;
  size_t local_88;
  long local_80 [2];
  string local_70;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  bVar2 = ConsumeMessageDelimiter(this,&local_70);
  if (bVar2) {
    do {
      local_90 = local_80;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,">","");
      sVar1 = (this->tokenizer_).current_.text._M_string_length;
      if (sVar1 == local_88) {
        if (sVar1 == 0) {
          bVar2 = true;
        }
        else {
          iVar3 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,local_90,sVar1);
          bVar2 = iVar3 == 0;
        }
      }
      else {
        bVar2 = false;
      }
      if (bVar2) {
LAB_005de138:
        bVar4 = false;
      }
      else {
        local_50 = local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"}","");
        sVar1 = (this->tokenizer_).current_.text._M_string_length;
        bVar4 = true;
        if (sVar1 == local_48) {
          if (sVar1 == 0) goto LAB_005de138;
          iVar3 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,local_50,sVar1);
          bVar4 = iVar3 != 0;
        }
      }
      if ((!bVar2) && (local_50 != local_40)) {
        operator_delete(local_50,local_40[0] + 1);
      }
      if (local_90 != local_80) {
        operator_delete(local_90,local_80[0] + 1);
      }
      if (!bVar4) {
        bVar2 = Consume(this,&local_70);
        goto LAB_005de1e6;
      }
      bVar2 = SkipField(this);
    } while (bVar2);
  }
  bVar2 = false;
LAB_005de1e6:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  return bVar2;
}

Assistant:

bool SkipFieldMessage() {
    string delimiter;
    DO(ConsumeMessageDelimiter(&delimiter));
    while (!LookingAt(">") &&  !LookingAt("}")) {
      DO(SkipField());
    }
    DO(Consume(delimiter));
    return true;
  }